

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::BrandScope::BrandScope
          (BrandScope *this,ErrorReporter *errorReporter,uint64_t startingScopeId,
          uint startingScopeParamCount,Resolver *startingScope)

{
  NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> p;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_f8;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_e8;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  Resolver *local_c0;
  char local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  char local_80;
  BrandScope *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Resolver *local_58;
  char local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0021d240;
  this->errorReporter = errorReporter;
  (this->parent).ptr.disposer = (Disposer *)0x0;
  (this->parent).ptr.ptr = (BrandScope *)0x0;
  this->leafId = startingScopeId;
  this->leafParamCount = startingScopeParamCount;
  this->inherited = true;
  (this->params).ptr = (BrandedDecl *)0x0;
  (this->params).size_ = 0;
  (this->params).disposer = (ArrayDisposer *)0x0;
  (*startingScope->_vptr_Resolver[4])(&local_e8,startingScope);
  local_80 = (char)local_e8.disposer;
  if ((char)local_e8.disposer == '\x01') {
    local_58 = local_c0;
    local_68 = local_d0;
    uStack_60 = uStack_c8;
    local_78 = local_e8.ptr;
    uStack_70 = uStack_d8;
    local_50 = local_b8;
    if (local_b8 == '\x01') {
      local_28 = local_90;
      uStack_20 = uStack_88;
      local_38 = local_a0;
      uStack_30 = uStack_98;
      local_48 = local_b0;
      uStack_40 = uStack_a8;
    }
    kj::
    refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::NodeTranslator::Resolver&>
              ((kj *)&local_f8,errorReporter,(unsigned_long *)&local_78,(uint *)&uStack_70,local_c0)
    ;
    local_e8.disposer = local_f8.disposer;
    local_e8.ptr = local_f8.ptr;
    local_f8.ptr = (BrandScope *)0x0;
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=(&(this->parent).ptr,&local_e8);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose(&local_e8);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::dispose(&local_f8);
  }
  return;
}

Assistant:

BrandScope(ErrorReporter& errorReporter, uint64_t startingScopeId,
             uint startingScopeParamCount, Resolver& startingScope)
      : errorReporter(errorReporter), parent(nullptr), leafId(startingScopeId),
        leafParamCount(startingScopeParamCount), inherited(true) {
    // Create all lexical parent scopes, all with no brand bindings.
    KJ_IF_MAYBE(p, startingScope.getParent()) {
      parent = kj::refcounted<BrandScope>(
          errorReporter, p->id, p->genericParamCount, *p->resolver);
    }
  }